

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void abgr_8888_to_rgba_4444
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  uint uVar2;
  ushort uVar3;
  ushort *puVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  
  if (0 < height) {
    puVar4 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar5 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar6 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar6 = src_pitch;
    }
    iVar7 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar4 + width;
        do {
          uVar2 = *puVar5;
          uVar3 = (ushort)(uVar2 >> 0x10);
          *puVar4 = (ushort)((uVar2 & 0xf0) << 8) |
                    (ushort)(uVar2 >> 4) & 0xf00 | uVar3 & 0xf0 | uVar3 >> 0xc;
          puVar4 = puVar4 + 1;
          puVar5 = puVar5 + 1;
        } while (puVar4 < puVar1);
      }
      puVar5 = puVar5 + ((iVar6 >> 2) - width);
      puVar4 = puVar4 + (dst_pitch / 2 - width);
      iVar7 = iVar7 + 1;
    } while (iVar7 != height);
  }
  return;
}

Assistant:

static void abgr_8888_to_rgba_4444(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_8888_TO_RGBA_4444(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}